

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ellswift_prng(uchar *out32,secp256k1_sha256 *hasher,uint32_t cnt)

{
  void *in_RSI;
  uchar buf4 [4];
  secp256k1_sha256 hash;
  size_t in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  secp256k1_sha256 *in_stack_ffffffffffffff90;
  
  memcpy(&stack0xffffffffffffff80,in_RSI,0x68);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  secp256k1_sha256_finalize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

static void secp256k1_ellswift_prng(unsigned char* out32, const secp256k1_sha256 *hasher, uint32_t cnt) {
    secp256k1_sha256 hash = *hasher;
    unsigned char buf4[4];
#ifdef VERIFY
    size_t blocks = hash.bytes >> 6;
#endif
    buf4[0] = cnt;
    buf4[1] = cnt >> 8;
    buf4[2] = cnt >> 16;
    buf4[3] = cnt >> 24;
    secp256k1_sha256_write(&hash, buf4, 4);
    secp256k1_sha256_finalize(&hash, out32);

    /* Writing and finalizing together should trigger exactly one SHA256 compression. */
    VERIFY_CHECK(((hash.bytes) >> 6) == (blocks + 1));
}